

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_analyze.hpp
# Opt level: O3

idx_t duckdb::AlpFinalAnalyze<float>(AnalyzeState *state)

{
  BlockManager *pBVar1;
  _func_int **pp_Var2;
  bool bVar3;
  BlockManager *pBVar4;
  vector<float,_true> *vector_to_compress;
  BlockManager *pBVar5;
  ulong uVar6;
  
  alp::AlpCompression<float,_true>::FindTopKCombinations
            ((vector<duckdb::vector<float,_true>,_true> *)&state[3].info,(State *)&state[6].info);
  pBVar5 = (BlockManager *)state[5]._vptr_AnalyzeState;
  pBVar1 = state[5].info.block_manager;
  if (pBVar5 == pBVar1) {
    state[1]._vptr_AnalyzeState =
         (_func_int **)
         ((long)&(state[1].info.block_manager)->_vptr_BlockManager +
         (long)state[1]._vptr_AnalyzeState + 4);
    state[1].info.block_manager = (BlockManager *)0x0;
  }
  else {
    uVar6 = 0;
    do {
      alp::AlpCompression<float,_true>::Compress
                ((float *)pBVar5->_vptr_BlockManager,
                 (long)pBVar5->buffer_manager - (long)pBVar5->_vptr_BlockManager >> 2,
                 (uint16_t *)0x0,0,(State *)&state[6].info);
      bVar3 = AlpAnalyzeState<float>::HasEnoughSpace((AlpAnalyzeState<float> *)state);
      pBVar4 = state[1].info.block_manager;
      if (!bVar3) {
        state[1]._vptr_AnalyzeState =
             (_func_int **)
             ((long)&pBVar4->_vptr_BlockManager + (long)state[1]._vptr_AnalyzeState + 4);
        pBVar4 = (BlockManager *)0x0;
      }
      pBVar4 = (BlockManager *)
               ((long)state[7]._vptr_AnalyzeState +
               (long)((pBVar4->blocks_lock).super___mutex_base._M_mutex.__size +
                     (ulong)*(ushort *)((long)&state[6].info.block_manager + 2) * 6 + 1));
      state[1].info.block_manager = pBVar4;
      *(undefined4 *)&state[6].info.block_manager = 0;
      *(undefined2 *)((long)&state[6].info.block_manager + 4) = 0;
      uVar6 = uVar6 + ((long)pBVar5->buffer_manager - (long)pBVar5->_vptr_BlockManager >> 2);
      pBVar5 = (BlockManager *)((pBVar5->blocks_lock).super___mutex_base._M_mutex.__size + 8);
    } while (pBVar5 != pBVar1);
    pp_Var2 = state[1]._vptr_AnalyzeState;
    state[1]._vptr_AnalyzeState =
         (_func_int **)((long)&pBVar4->_vptr_BlockManager + (long)pp_Var2 + 4);
    state[1].info.block_manager = (BlockManager *)0x0;
    if (uVar6 != 0) {
      return ((long)&pBVar4->buffer_manager + (long)pp_Var2 + 3 & 0xfffffffffffffff8U) *
             ((ulong)state[2].info.block_manager / uVar6);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

idx_t AlpFinalAnalyze(AnalyzeState &state) {
	auto &analyze_state = (AlpAnalyzeState<T> &)state;

	// Finding the Top K combinations of Exponent and Factor
	alp::AlpCompression<T, true>::FindTopKCombinations(analyze_state.rowgroup_sample, analyze_state.state);

	// Encode the entire sampled vectors to estimate a compression size
	idx_t compressed_values = 0;
	for (auto &vector_to_compress : analyze_state.complete_vectors_sampled) {
		alp::AlpCompression<T, true>::Compress(vector_to_compress.data(), vector_to_compress.size(),
		                                       analyze_state.state);
		if (!analyze_state.HasEnoughSpace()) {
			analyze_state.FlushSegment();
		}
		analyze_state.FlushVector();
		compressed_values += vector_to_compress.size();
	}

	// Flush last unfinished segment
	analyze_state.FlushSegment();

	if (compressed_values == 0) {
		return DConstants::INVALID_INDEX;
	}

	// We estimate the size by taking into account the portion of the values we took
	const auto factor_of_sampling = analyze_state.total_values_count / compressed_values;
	const auto final_analyze_size = analyze_state.TotalUsedBytes() * factor_of_sampling;
	return final_analyze_size; // return size of data in bytes
}